

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

ArchType parseARMArch(StringRef ArchName)

{
  ISAKind IVar1;
  EndianKind EVar2;
  ProfileKind PVar3;
  uint uVar4;
  size_t sVar5;
  size_t in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  ARM *this;
  bool bVar6;
  bool bVar7;
  StringRef Arch;
  StringRef Arch_00;
  StringRef SVar8;
  uint Version;
  ProfileKind Profile;
  char *local_110;
  ulong local_108;
  ArchType local_fc;
  ArchType arch;
  EndianKind ENDIAN;
  ISAKind ISA;
  StringRef ArchName_local;
  int local_2c;
  int local_c;
  
  SVar8.Data = (char *)ArchName.Length;
  this = (ARM *)ArchName.Data;
  SVar8.Length = in_RDX;
  IVar1 = llvm::ARM::parseArchISA(this,SVar8);
  Arch.Length = extraout_RDX;
  Arch.Data = SVar8.Data;
  EVar2 = llvm::ARM::parseArchEndian(this,Arch);
  local_fc = UnknownArch;
  if (EVar2 != INVALID) {
    if (EVar2 == LITTLE) {
      switch(IVar1) {
      case INVALID:
        break;
      case ARM:
        local_fc = arm;
        break;
      case THUMB:
        local_fc = thumb;
        break;
      case AARCH64:
        local_fc = aarch64;
      }
    }
    else if (EVar2 == BIG) {
      switch(IVar1) {
      case INVALID:
        break;
      case ARM:
        local_fc = armeb;
        break;
      case THUMB:
        local_fc = thumbeb;
        break;
      case AARCH64:
        local_fc = aarch64_be;
      }
    }
  }
  Arch_00.Length = extraout_RDX_00;
  Arch_00.Data = SVar8.Data;
  SVar8 = llvm::ARM::getCanonicalArchName(this,Arch_00);
  local_110 = SVar8.Data;
  local_108 = SVar8.Length;
  if (local_108 == 0) {
    ArchName_local.Length._4_4_ = UnknownArch;
  }
  else {
    bVar7 = false;
    if (IVar1 == THUMB) {
      sVar5 = strlen("v2");
      bVar6 = false;
      if (sVar5 <= local_108) {
        if (sVar5 == 0) {
          local_2c = 0;
        }
        else {
          local_2c = memcmp(local_110,"v2",sVar5);
        }
        bVar6 = local_2c == 0;
      }
      bVar7 = true;
      if (!bVar6) {
        sVar5 = strlen("v3");
        bVar7 = false;
        if (sVar5 <= local_108) {
          if (sVar5 == 0) {
            local_c = 0;
          }
          else {
            local_c = memcmp(local_110,"v3",sVar5);
          }
          bVar7 = local_c == 0;
        }
      }
    }
    if (bVar7) {
      ArchName_local.Length._4_4_ = UnknownArch;
    }
    else {
      PVar3 = llvm::ARM::parseArchProfile(SVar8);
      uVar4 = llvm::ARM::parseArchVersion(SVar8);
      if ((PVar3 == M) && (uVar4 == 6)) {
        if (EVar2 == BIG) {
          ArchName_local.Length._4_4_ = thumbeb;
        }
        else {
          ArchName_local.Length._4_4_ = thumb;
        }
      }
      else {
        ArchName_local.Length._4_4_ = local_fc;
      }
    }
  }
  return ArchName_local.Length._4_4_;
}

Assistant:

static Triple::ArchType parseARMArch(StringRef ArchName) {
  ARM::ISAKind ISA = ARM::parseArchISA(ArchName);
  ARM::EndianKind ENDIAN = ARM::parseArchEndian(ArchName);

  Triple::ArchType arch = Triple::UnknownArch;
  switch (ENDIAN) {
  case ARM::EndianKind::LITTLE: {
    switch (ISA) {
    case ARM::ISAKind::ARM:
      arch = Triple::arm;
      break;
    case ARM::ISAKind::THUMB:
      arch = Triple::thumb;
      break;
    case ARM::ISAKind::AARCH64:
      arch = Triple::aarch64;
      break;
    case ARM::ISAKind::INVALID:
      break;
    }
    break;
  }
  case ARM::EndianKind::BIG: {
    switch (ISA) {
    case ARM::ISAKind::ARM:
      arch = Triple::armeb;
      break;
    case ARM::ISAKind::THUMB:
      arch = Triple::thumbeb;
      break;
    case ARM::ISAKind::AARCH64:
      arch = Triple::aarch64_be;
      break;
    case ARM::ISAKind::INVALID:
      break;
    }
    break;
  }
  case ARM::EndianKind::INVALID: {
    break;
  }
  }

  ArchName = ARM::getCanonicalArchName(ArchName);
  if (ArchName.empty())
    return Triple::UnknownArch;

  // Thumb only exists in v4+
  if (ISA == ARM::ISAKind::THUMB &&
      (ArchName.startswith("v2") || ArchName.startswith("v3")))
    return Triple::UnknownArch;

  // Thumb only for v6m
  ARM::ProfileKind Profile = ARM::parseArchProfile(ArchName);
  unsigned Version = ARM::parseArchVersion(ArchName);
  if (Profile == ARM::ProfileKind::M && Version == 6) {
    if (ENDIAN == ARM::EndianKind::BIG)
      return Triple::thumbeb;
    else
      return Triple::thumb;
  }

  return arch;
}